

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int local_68;
  int local_64;
  stbi__context *psStack_48;
  int channels;
  void *result;
  stbi__result_info ri;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  ri.num_channels = req_comp;
  unique0x10000099 = comp;
  psStack_48 = (stbi__context *)
               stbi__load_main(s,x,y,comp,req_comp,(stbi__result_info *)&result,0x10);
  if (psStack_48 == (stbi__context *)0x0) {
    s_local = (stbi__context *)0x0;
  }
  else {
    if ((int)result != 0x10) {
      if ((int)result != 8) {
        __assert_fail("ri.bits_per_channel == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                      ,0x480,
                      "stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
      if (ri.num_channels == 0) {
        local_64 = *stack0xffffffffffffffd0;
      }
      else {
        local_64 = ri.num_channels;
      }
      psStack_48 = (stbi__context *)stbi__convert_8_to_16((stbi_uc *)psStack_48,*x,*y,local_64);
      result._0_4_ = 0x10;
    }
    if (stbi__vertically_flip_on_load != 0) {
      if (ri.num_channels == 0) {
        local_68 = *stack0xffffffffffffffd0;
      }
      else {
        local_68 = ri.num_channels;
      }
      stbi__vertical_flip(psStack_48,*x,*y,local_68 << 1);
    }
    s_local = psStack_48;
  }
  return (stbi__uint16 *)s_local;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   if (ri.bits_per_channel != 16) {
      STBI_ASSERT(ri.bits_per_channel == 8);
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}